

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkTiming.c
# Opt level: O2

float Nwk_NodeComputeArrival(Nwk_Obj_t *pObj,int fUseSorting)

{
  float (*pafVar1) [33];
  If_LibLut_t *pIVar2;
  float fVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  int pPinPerm [32];
  float pPinDelays [32];
  int local_118 [32];
  float local_98 [34];
  
  uVar4 = *(uint *)&pObj->field_0x20 & 7;
  if (uVar4 == 1) {
    fVar7 = pObj->tArrival;
  }
  else if (uVar4 == 2) {
    fVar7 = (*pObj->pFanio)->tArrival;
  }
  else {
    if (uVar4 != 3) {
      __assert_fail("Nwk_ObjIsNode(pObj) || Nwk_ObjIsCi(pObj) || Nwk_ObjIsCo(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkTiming.c"
                    ,0x8b,"float Nwk_NodeComputeArrival(Nwk_Obj_t *, int)");
    }
    pIVar2 = pObj->pMan->pLutLib;
    if (pIVar2 == (If_LibLut_t *)0x0) {
      uVar4 = pObj->nFanins;
      uVar5 = 0;
      uVar6 = 0;
      if (0 < (int)uVar4) {
        uVar6 = (ulong)uVar4;
      }
      fVar8 = -1e+09;
      for (; (uVar6 != uVar5 && (pObj->pFanio[uVar5] != (Nwk_Obj_t *)0x0)); uVar5 = uVar5 + 1) {
        fVar7 = pObj->pFanio[uVar5]->tArrival;
        fVar3 = fVar7 + 1.0;
        if (fVar7 + 1.0 <= fVar8) {
          fVar3 = fVar8;
        }
        fVar8 = fVar3;
      }
    }
    else {
      uVar4 = pObj->nFanins;
      pafVar1 = pIVar2->pLutDelays + (int)uVar4;
      if (pIVar2->fVarPinDelays == 0) {
        uVar5 = 0;
        uVar6 = 0;
        if (0 < (int)uVar4) {
          uVar6 = (ulong)uVar4;
        }
        fVar8 = -1e+09;
        for (; (uVar6 != uVar5 && (pObj->pFanio[uVar5] != (Nwk_Obj_t *)0x0)); uVar5 = uVar5 + 1) {
          fVar7 = pObj->pFanio[uVar5]->tArrival + (*pafVar1)[0];
          if (fVar7 <= fVar8) {
            fVar7 = fVar8;
          }
          fVar8 = fVar7;
        }
      }
      else if (fUseSorting == 0) {
        uVar5 = 0;
        uVar6 = 0;
        if (0 < (int)uVar4) {
          uVar6 = (ulong)uVar4;
        }
        fVar8 = -1e+09;
        for (; (uVar6 != uVar5 && (pObj->pFanio[uVar5] != (Nwk_Obj_t *)0x0)); uVar5 = uVar5 + 1) {
          fVar7 = pObj->pFanio[uVar5]->tArrival + (*pafVar1)[uVar5];
          if (fVar7 <= fVar8) {
            fVar7 = fVar8;
          }
          fVar8 = fVar7;
        }
      }
      else {
        Nwk_ManDelayTraceSortPins(pObj,local_118,local_98);
        uVar4 = pObj->nFanins;
        uVar5 = 0;
        uVar6 = 0;
        if (0 < (int)uVar4) {
          uVar6 = (ulong)uVar4;
        }
        fVar8 = -1e+09;
        for (; (uVar6 != uVar5 && (pObj->pFanio[uVar5] != (Nwk_Obj_t *)0x0)); uVar5 = uVar5 + 1) {
          fVar7 = pObj->pFanio[local_118[uVar5]]->tArrival + (*pafVar1)[uVar5];
          if (fVar7 <= fVar8) {
            fVar7 = fVar8;
          }
          fVar8 = fVar7;
        }
      }
    }
    fVar7 = 0.0;
    if (uVar4 != 0) {
      fVar7 = fVar8;
    }
  }
  return fVar7;
}

Assistant:

float Nwk_NodeComputeArrival( Nwk_Obj_t * pObj, int fUseSorting )
{
    If_LibLut_t * pLutLib = pObj->pMan->pLutLib;
    int pPinPerm[32];
    float pPinDelays[32];
    Nwk_Obj_t * pFanin;
    float tArrival, * pDelays;
    int k;
    assert( Nwk_ObjIsNode(pObj) || Nwk_ObjIsCi(pObj) || Nwk_ObjIsCo(pObj) );
    if ( Nwk_ObjIsCi(pObj) )
        return Nwk_ObjArrival(pObj);
    if ( Nwk_ObjIsCo(pObj) )
        return Nwk_ObjArrival( Nwk_ObjFanin0(pObj) );
    tArrival = -TIM_ETERNITY;
    if ( pLutLib == NULL )
    {
        Nwk_ObjForEachFanin( pObj, pFanin, k )
            if ( tArrival < Nwk_ObjArrival(pFanin) + 1.0 )
                tArrival = Nwk_ObjArrival(pFanin) + 1.0;
    }
    else if ( !pLutLib->fVarPinDelays )
    {
        pDelays = pLutLib->pLutDelays[Nwk_ObjFaninNum(pObj)];
        Nwk_ObjForEachFanin( pObj, pFanin, k )
            if ( tArrival < Nwk_ObjArrival(pFanin) + pDelays[0] )
                tArrival = Nwk_ObjArrival(pFanin) + pDelays[0];
    }
    else
    {
        pDelays = pLutLib->pLutDelays[Nwk_ObjFaninNum(pObj)];
        if ( fUseSorting )
        {
            Nwk_ManDelayTraceSortPins( pObj, pPinPerm, pPinDelays );
            Nwk_ObjForEachFanin( pObj, pFanin, k ) 
                if ( tArrival < Nwk_ObjArrival(Nwk_ObjFanin(pObj,pPinPerm[k])) + pDelays[k] )
                    tArrival = Nwk_ObjArrival(Nwk_ObjFanin(pObj,pPinPerm[k])) + pDelays[k];
        }
        else
        {
            Nwk_ObjForEachFanin( pObj, pFanin, k )
                if ( tArrival < Nwk_ObjArrival(pFanin) + pDelays[k] )
                    tArrival = Nwk_ObjArrival(pFanin) + pDelays[k];
        }
    }
    if ( Nwk_ObjFaninNum(pObj) == 0 )
        tArrival = 0.0;
    return tArrival;
}